

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O0

_Bool bp_wp_matches(ARMCPU_conflict1 *cpu,int n,_Bool is_wp)

{
  CPUWatchpoint *pCVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint32_t uVar4;
  CPUARMState_conflict *env_00;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong local_68;
  uint64_t pc;
  CPUWatchpoint *wp;
  int access_el;
  _Bool is_secure;
  int lbn;
  int wt;
  int ssc;
  int hmc;
  int pac;
  uint64_t cr;
  CPUARMState_conflict *env;
  _Bool is_wp_local;
  int n_local;
  ARMCPU_conflict1 *cpu_local;
  
  env_00 = &cpu->env;
  _Var2 = arm_is_secure(env_00);
  wp._4_4_ = arm_current_el(env_00);
  if (is_wp) {
    pCVar1 = (cpu->env).cpu_watchpoint[n];
    if ((pCVar1 == (CPUWatchpoint *)0x0) || ((pCVar1->flags & 0xc0U) == 0)) {
      return false;
    }
    _hmc = (cpu->env).cp15.dbgwcr[n];
    if (((uint)pCVar1->hitattrs >> 2 & 1) != 0) {
      wp._4_4_ = 0;
    }
  }
  else {
    _Var3 = is_a64(env_00);
    if (_Var3) {
      local_68 = (cpu->env).pc;
    }
    else {
      local_68 = (ulong)(cpu->env).regs[0xf];
    }
    if (((cpu->env).cpu_breakpoint[n] == (CPUBreakpoint *)0x0) ||
       ((cpu->env).cpu_breakpoint[n]->pc != local_68)) {
      return false;
    }
    _hmc = (cpu->env).cp15.dbgbcr[n];
  }
  uVar5 = extract64(_hmc,1,2);
  uVar6 = extract64(_hmc,0xd,1);
  uVar7 = extract64(_hmc,0xe,2);
  switch(uVar7 & 0xffffffff) {
  case 0:
    break;
  case 1:
  case 3:
    if (_Var2) {
      return false;
    }
    break;
  case 2:
    if (!_Var2) {
      return false;
    }
  }
  if (wp._4_4_ == 0) {
    uVar4 = extract32((uint32_t)uVar5,1,1);
    if (uVar4 == 0) {
      return false;
    }
  }
  else if (wp._4_4_ == 1) {
    uVar4 = extract32((uint32_t)uVar5,0,1);
    if (uVar4 == 0) {
      return false;
    }
  }
  else {
    if (wp._4_4_ != 2 && wp._4_4_ != 3) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/debug_helper.c"
                 ,0xb8,(char *)0x0);
    }
    if ((int)uVar6 == 0) {
      return false;
    }
  }
  uVar5 = extract64(_hmc,0x14,1);
  uVar6 = extract64(_hmc,0x10,4);
  if (((int)uVar5 == 0) || (_Var2 = linked_bp_matches(cpu,(int)uVar6), _Var2)) {
    cpu_local._7_1_ = true;
  }
  else {
    cpu_local._7_1_ = false;
  }
  return cpu_local._7_1_;
}

Assistant:

static bool bp_wp_matches(ARMCPU *cpu, int n, bool is_wp)
{
    CPUARMState *env = &cpu->env;
    uint64_t cr;
    int pac, hmc, ssc, wt, lbn;
    /*
     * Note that for watchpoints the check is against the CPU security
     * state, not the S/NS attribute on the offending data access.
     */
    bool is_secure = arm_is_secure(env);
    int access_el = arm_current_el(env);

    if (is_wp) {
        CPUWatchpoint *wp = env->cpu_watchpoint[n];

        if (!wp || !(wp->flags & BP_WATCHPOINT_HIT)) {
            return false;
        }
        cr = env->cp15.dbgwcr[n];
        if (wp->hitattrs.user) {
            /*
             * The LDRT/STRT/LDT/STT "unprivileged access" instructions should
             * match watchpoints as if they were accesses done at EL0, even if
             * the CPU is at EL1 or higher.
             */
            access_el = 0;
        }
    } else {
        uint64_t pc = is_a64(env) ? env->pc : env->regs[15];

        if (!env->cpu_breakpoint[n] || env->cpu_breakpoint[n]->pc != pc) {
            return false;
        }
        cr = env->cp15.dbgbcr[n];
    }
    /*
     * The WATCHPOINT_HIT flag guarantees us that the watchpoint is
     * enabled and that the address and access type match; for breakpoints
     * we know the address matched; check the remaining fields, including
     * linked breakpoints. We rely on WCR and BCR having the same layout
     * for the LBN, SSC, HMC, PAC/PMC and is-linked fields.
     * Note that some combinations of {PAC, HMC, SSC} are reserved and
     * must act either like some valid combination or as if the watchpoint
     * were disabled. We choose the former, and use this together with
     * the fact that EL3 must always be Secure and EL2 must always be
     * Non-Secure to simplify the code slightly compared to the full
     * table in the ARM ARM.
     */
    pac = extract64(cr, 1, 2);
    hmc = extract64(cr, 13, 1);
    ssc = extract64(cr, 14, 2);

    switch (ssc) {
    case 0:
        break;
    case 1:
    case 3:
        if (is_secure) {
            return false;
        }
        break;
    case 2:
        if (!is_secure) {
            return false;
        }
        break;
    }

    switch (access_el) {
    case 3:
    case 2:
        if (!hmc) {
            return false;
        }
        break;
    case 1:
        if (extract32(pac, 0, 1) == 0) {
            return false;
        }
        break;
    case 0:
        if (extract32(pac, 1, 1) == 0) {
            return false;
        }
        break;
    default:
        g_assert_not_reached();
    }

    wt = extract64(cr, 20, 1);
    lbn = extract64(cr, 16, 4);

    if (wt && !linked_bp_matches(cpu, lbn)) {
        return false;
    }

    return true;
}